

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O1

bool __thiscall
IR::Instr::IterateArgInstrs<BackwardPass::ProcessInlineeStart(IR::Instr*)::__0>
          (Instr *this,anon_class_8_1_da3b4f2a callback)

{
  Opnd *this_00;
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  OpCode OVar5;
  StackSym *pSVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  Instr *argInstr;
  anon_class_8_1_da3b4f2a local_38;
  anon_class_8_1_da3b4f2a callback_local;
  
  local_38.startCallInstr = callback.startCallInstr;
  pSVar6 = Opnd::GetStackSym(this->m_src2);
  if (((pSVar6->field_0x18 & 1) == 0) || ((pSVar6->field_5).m_instrDef == (Instr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar3) {
LAB_003ef454:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  argInstr = (pSVar6->field_5).m_instrDef;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (argInstr->m_src2 == (Opnd *)0x0) {
LAB_003ef3c7:
      pIVar8 = (Instr *)0x0;
    }
    else {
      OVar4 = Opnd::GetKind(argInstr->m_src2);
      if (OVar4 != OpndKindSym) goto LAB_003ef3c7;
      this_00 = argInstr->m_src2;
      OVar4 = Opnd::GetKind(this_00);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar3) goto LAB_003ef454;
        *puVar7 = 0;
      }
      pp_Var1 = this_00[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar3) goto LAB_003ef454;
        *puVar7 = 0;
      }
      if (((*(byte *)((long)pp_Var1 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar3) goto LAB_003ef454;
        *puVar7 = 0;
      }
      if ((*(byte *)((long)pp_Var1 + 0x1a) & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar3) goto LAB_003ef454;
        *puVar7 = 0;
      }
      if ((((ulong)pp_Var1[3] & 1) == 0) || (pp_Var1[5] == (_func_int *)0x0)) {
        bVar3 = Func::IsInPhase(this->m_func,FGPeepsPhase);
        if (!bVar3) {
          bVar3 = Func::IsInPhase(this->m_func,FGBuildPhase);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar3) goto LAB_003ef454;
            *puVar7 = 0;
          }
        }
      }
      if (((ulong)pp_Var1[3] & 1) == 0) goto LAB_003ef3c7;
      pIVar8 = (Instr *)pp_Var1[5];
    }
    OVar5 = argInstr->m_opcode;
    if (OVar5 != ArgOut_A_InlineSpecialized) {
      if (OVar5 == StartCall) {
        if (pIVar8 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          OVar5 = (OpCode)bVar3;
          if (!bVar3) goto LAB_003ef454;
          *puVar7 = 0;
        }
        break;
      }
      bVar3 = BackwardPass::ProcessInlineeStart::anon_class_8_1_da3b4f2a::operator()
                        (&local_38,argInstr);
      OVar5 = (OpCode)bVar3;
    }
    argInstr = pIVar8;
  } while (pIVar8 != (Instr *)0x0);
  return SUB21(OVar5,0);
}

Assistant:

bool IterateArgInstrs(Fn callback)
    {
        StackSym* linkSym = this->GetSrc2()->GetStackSym();
        Assert(linkSym->IsSingleDef());
        IR::Instr *argInstr = linkSym->m_instrDef;
        IR::Instr* nextArg = nullptr;
        do
        {
            // Get the next instr before calling 'callback' since callback might modify the IR.
            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
            {
                linkSym = argInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
                Assert(linkSym->IsArgSlotSym());

                // Due to dead code elimination in FGPeeps, it is possible for the definitions of the
                // the instructions that we are visiting during FG to have been freed. In this case,
                // the ArgSlot, even though its was a single def, will report IsSingleDef() as false
                // since instrDef is reset to nullptr when the def instr is freed
                Assert(linkSym->IsSingleDef() ||
                    (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)));
                nextArg = linkSym->GetInstrDef();
            }
            else
            {
                nextArg = nullptr;
            }
            if(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)
            {
                argInstr = nextArg;
                // This is a fake ArgOut, skip it
                continue;
            }
            if (argInstr->m_opcode == Js::OpCode::StartCall)
            {
                Assert(nextArg == nullptr);
                break;
            }

            if(callback(argInstr))
            {
                return true;
            }
            argInstr = nextArg;
        } while(argInstr && !argInstr->IsInvalidInstr());

        // If an instr in the call sequence is invalid (0xFDFDFDFD), it must have been freed.
        // This is possible if some dead-code-removal/peeps code removed only part of the call sequence, while the whole sequence was dead (TH Bug 594245).
        // We allow this possibility here, while relying on the more involved dead-code-removal to remove the rest of the call sequence.
        // Inserting the opcode InvalidOpCode, with no lowering, here to safeguard against the possibility of a dead part of the call sequence not being removed. The lowerer would assert then.
        if (argInstr && argInstr->IsInvalidInstr())
        {
            this->InsertBefore(Instr::New(Js::OpCode::InvalidOpCode, this->m_func));
        }
        return false;
    }